

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsqltablemodel_p.h
# Opt level: O0

void __thiscall
QSqlTableModelPrivate::ModifiedRow::ModifiedRow(ModifiedRow *this,Op o,QSqlRecord *r)

{
  undefined8 in_RDX;
  int in_ESI;
  QSqlRecord *in_RDI;
  QSqlRecord *in_stack_ffffffffffffffd8;
  Op o_00;
  undefined4 in_stack_fffffffffffffff0;
  
  o_00 = (Op)((ulong)in_RDX >> 0x20);
  *(undefined4 *)&(in_RDI->d).d.ptr = 0;
  QSqlRecord::QSqlRecord(in_RDI);
  QSqlRecord::QSqlRecord(in_RDI,in_stack_ffffffffffffffd8);
  *(bool *)((long)&in_RDI[3].d.d.ptr + 1) = in_ESI == 1;
  setOp((ModifiedRow *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),o_00);
  return;
}

Assistant:

inline ModifiedRow(Op o = None, const QSqlRecord &r = QSqlRecord())
            : m_op(None), m_db_values(r), m_insert(o == Insert)
        { setOp(o); }